

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Observed_Base.cpp
# Opt level: O0

uint8_t * __thiscall
SRUP_MSG_OBS_BASE::encrypted_data(SRUP_MSG_OBS_BASE *this,bool key_string,char *key)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  char *key_local;
  bool key_string_local;
  SRUP_MSG_OBS_BASE *this_local;
  
  pcVar1 = SRUP_Crypto::crypt(this->m_crypto,(char *)CONCAT71(in_register_00000031,key_string),key);
  if (pcVar1 == (char *)0x0) {
    this_local = (SRUP_MSG_OBS_BASE *)0x0;
  }
  else if (key_string) {
    this_local = (SRUP_MSG_OBS_BASE *)SRUP_Crypto::Decrypt(this->m_crypto,key);
  }
  else {
    this_local = (SRUP_MSG_OBS_BASE *)SRUP_Crypto::DecryptF(this->m_crypto,key);
  }
  return (uint8_t *)this_local;
}

Assistant:

const uint8_t *SRUP_MSG_OBS_BASE::encrypted_data(bool key_string, char* key)
{
    if (m_crypto->crypt() != nullptr)
    {
        if (key_string)
            return m_crypto->Decrypt(key);
        else
            return m_crypto->DecryptF(key);
    }
    else
        return nullptr;
}